

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

void __thiscall QMainWindowTabBar::mouseMoveEvent(QMainWindowTabBar *this,QMouseEvent *e)

{
  QWeakPointer<QObject> *this_00;
  QTabBarPrivate *this_01;
  QMovableTabWidget *pQVar1;
  QDockWidgetPrivate *this_02;
  long lVar2;
  QPointF QVar3;
  bool bVar4;
  char cVar5;
  DockOptions DVar6;
  int iVar7;
  DockWidgetFeatures DVar8;
  QObject *ptr;
  QLayout *pQVar9;
  QPoint QVar10;
  QWidget *this_03;
  int iVar11;
  QWidget *this_04;
  long in_FS_OFFSET;
  QRect QVar12;
  QPointF local_60;
  QPoint local_50;
  QPointF local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QTabBarPrivate **)(this + 8);
  this_00 = (QWeakPointer<QObject> *)(this + 0x30);
  bVar4 = QPointer::operator_cast_to_bool((QPointer *)this_00);
  if (!bVar4) {
    DVar6 = QMainWindow::dockOptions(*(QMainWindow **)(this + 0x28));
    if (((uint)DVar6.super_QFlagsStorageHelper<QMainWindow::DockOption,_4>.
               super_QFlagsStorage<QMainWindow::DockOption>.i & 0x20) != 0) {
      iVar7 = QApplication::startDragDistance();
      QVar12 = QWidget::rect((QWidget *)this);
      iVar11 = iVar7 * -3 + -3;
      local_48.xp._4_4_ = QVar12.y1.m_i.m_i + iVar11;
      local_48.xp._0_4_ = QVar12.x1.m_i.m_i + iVar11;
      local_48.yp._4_4_ = QVar12.y2.m_i.m_i + iVar7 * 3 + 3;
      local_48.yp._0_4_ = QVar12.x2.m_i.m_i + iVar7 * 3 + 3;
      if ((*(uint *)&this_01->field_0x2d0 >> 9 & 1) != 0) {
        local_60 = QSinglePointEvent::position((QSinglePointEvent *)e);
        local_50 = QPointF::toPoint(&local_60);
        cVar5 = QRect::contains((QPoint *)&local_48,SUB81(&local_50,0));
        if (cVar5 == '\0') {
          iVar7 = this_01->pressedIndex;
          if ((-1 < (long)iVar7) && ((ulong)(long)iVar7 < (ulong)(this_01->tabList).d.size)) {
            ptr = (QObject *)dockAt(this,iVar7);
            QWeakPointer<QObject>::assign<QObject>(this_00,ptr);
            bVar4 = QPointer::operator_cast_to_bool((QPointer *)this_00);
            if (bVar4) {
              QTabBarPrivate::moveTabFinished(this_01,this_01->pressedIndex);
              this_01->pressedIndex = -1;
              pQVar1 = this_01->movingTab;
              if (pQVar1 != (QMovableTabWidget *)0x0) {
                (**(code **)(*(long *)&pQVar1->super_QWidget + 0x68))(pQVar1,0);
              }
              (this_01->dragStartPosition).xp = 0;
              (this_01->dragStartPosition).yp = 0;
              this_02 = *(QDockWidgetPrivate **)&(*(QWidget **)(this + 0x38))->field_0x8;
              pQVar9 = QWidget::layout(*(QWidget **)(this + 0x38));
              lVar2 = *(long *)&pQVar9[1].super_QLayoutItem.align;
              local_60.xp = (qreal)(((long)(int)*(long *)(pQVar9 + 2) + (long)(int)lVar2) / 2 &
                                    0xffffffffU |
                                   ((*(long *)(pQVar9 + 2) >> 0x20) + (lVar2 >> 0x20)) / 2 << 0x20);
              QDockWidgetPrivate::initDrag(this_02,(QPoint *)&local_60,true);
              QDockWidgetPrivate::startDrag(this_02,Widget);
              if (this_02->state != (DragState *)0x0) {
                this_02->state->ctrlDrag =
                     (bool)((byte)((uint)*(undefined4 *)(e + 0x20) >> 0x1a) & 1);
              }
            }
          }
        }
      }
    }
  }
  bVar4 = QPointer::operator_cast_to_bool((QPointer *)this_00);
  if (((bVar4) && (lVar2 = *(long *)(*(long *)(*(long *)(this + 0x38) + 8) + 600), lVar2 != 0)) &&
     (*(char *)(lVar2 + 0x18) == '\x01')) {
    local_48 = QSinglePointEvent::globalPosition((QSinglePointEvent *)e);
    QVar10 = QPointF::toPoint(&local_48);
    if ((this_00->d == (Data *)0x0) || (*(int *)(this_00->d + 4) == 0)) {
      this_04 = (QWidget *)0x0;
    }
    else {
      this_04 = *(QWidget **)(this + 0x38);
    }
    this_03 = QDockWidget::titleBarWidget((QDockWidget *)this_04);
    if (this_03 == (QWidget *)0x0) {
      DVar8 = QDockWidget::features((QDockWidget *)this_04);
      if (((uint)DVar8.super_QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>.
                 super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i & 8) == 0) {
        iVar7 = (((this_04->data->crect).x2.m_i - (this_04->data->crect).x1.m_i) + 1) / 2;
        iVar11 = QApplication::startDragDistance();
      }
      else {
        iVar7 = QApplication::startDragDistance();
        iVar11 = (((this_04->data->crect).y2.m_i - (this_04->data->crect).y1.m_i) + 1) / 2;
      }
      local_60.xp._4_4_ = QVar10.yp.m_i.m_i - iVar11;
      local_60.xp._0_4_ = QVar10.xp.m_i.m_i - iVar7;
    }
    else {
      QVar12 = QWidget::rect(this_03);
      QVar3 = local_60;
      local_60.xp._4_4_ =
           QVar10.yp.m_i.m_i + (int)(((QVar12._8_8_ >> 0x20) + (QVar12._0_8_ >> 0x20)) / -2);
      local_60.xp._0_4_ =
           QVar10.xp.m_i.m_i + (int)(((long)QVar12.x2.m_i.m_i + (long)QVar12.x1.m_i.m_i) / -2);
      local_60.yp = QVar3.yp;
    }
    QWidget::move(this_04,(QPoint *)&local_60);
  }
  QTabBar::mouseMoveEvent((QTabBar *)this,e);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMainWindowTabBar::mouseMoveEvent(QMouseEvent *e)
{
    // The QTabBar handles the moving (reordering) of tabs.
    // When QTabBarPrivate::dragInProgress is true, and that the mouse is outside of a region
    // around the QTabBar, we will consider the user wants to drag that QDockWidget away from this
    // tab area.

    QTabBarPrivate *d = static_cast<QTabBarPrivate*>(d_ptr.data());
    if (!draggingDock && (mainWindow->dockOptions() & QMainWindow::GroupedDragging)) {
        int offset = QApplication::startDragDistance() + 1;
        offset *= 3;
        QRect r = rect().adjusted(-offset, -offset, offset, offset);
        if (d->dragInProgress && !r.contains(e->position().toPoint()) && d->validIndex(d->pressedIndex)) {
            draggingDock = dockAt(d->pressedIndex);
            if (draggingDock) {
                // We should drag this QDockWidget away by unpluging it.
                // First cancel the QTabBar's internal move
                d->moveTabFinished(d->pressedIndex);
                d->pressedIndex = -1;
                if (d->movingTab)
                    d->movingTab->setVisible(false);
                d->dragStartPosition = QPoint();

                // Then starts the drag using QDockWidgetPrivate's API
                QDockWidgetPrivate *dockPriv = static_cast<QDockWidgetPrivate *>(QObjectPrivate::get(draggingDock));
                QDockWidgetLayout *dwlayout = static_cast<QDockWidgetLayout *>(draggingDock->layout());
                dockPriv->initDrag(dwlayout->titleArea().center(), true);
                dockPriv->startDrag(QDockWidgetPrivate::DragScope::Widget);
                if (dockPriv->state)
                    dockPriv->state->ctrlDrag = e->modifiers() & Qt::ControlModifier;
            }
        }
    }

    if (draggingDock) {
        QDockWidgetPrivate *dockPriv = static_cast<QDockWidgetPrivate *>(QObjectPrivate::get(draggingDock));
        if (dockPriv->state && dockPriv->state->dragging) {
            // move will call QMainWindowLayout::hover
            moveToUnplugPosition(e->globalPosition().toPoint(), draggingDock);
        }
    }
    QTabBar::mouseMoveEvent(e);
}